

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O2

int wally_asset_unblind_with_nonce
              (uchar *nonce_hash,size_t nonce_hash_len,uchar *proof,size_t proof_len,
              uchar *commitment,size_t commitment_len,uchar *extra,size_t extra_len,uchar *generator
              ,size_t generator_len,uchar *asset_out,size_t asset_out_len,uchar *abf_out,
              size_t abf_out_len,uchar *vbf_out,size_t vbf_out_len,uint64_t *value_out)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  int iVar2;
  secp256k1_generator *dest;
  int iVar3;
  undefined1 auVar4 [16];
  size_t message_len;
  uint64_t max_value;
  uint64_t min_value;
  uchar message [64];
  secp256k1_pedersen_commitment commit;
  secp256k1_generator gen;
  
  ctx = secp_ctx();
  message_len = 0x40;
  if (ctx == (secp256k1_context_struct *)0x0) {
    iVar3 = -3;
  }
  else {
    iVar3 = -2;
    if ((proof_len != 0 && nonce_hash_len == 0x20) &&
        (proof != (uchar *)0x0 && nonce_hash != (uchar *)0x0)) {
      iVar1 = get_commitment(ctx,commitment,commitment_len,&commit);
      if ((iVar1 == 0) && (extra != (uchar *)0x0 || extra_len == 0)) {
        dest = &gen;
        iVar1 = get_generator(ctx,generator,generator_len,dest);
        auVar4._0_4_ = -(uint)(asset_out == (uchar *)0x0);
        auVar4._4_4_ = -(uint)(abf_out == (uchar *)0x0);
        auVar4._8_4_ = -(uint)(vbf_out == (uchar *)0x0);
        auVar4._12_4_ = -(uint)(value_out == (uint64_t *)0x0);
        iVar2 = movmskps((int)dest,auVar4);
        if (((iVar2 == 0) &&
            (((asset_out_len == 0x20 && (abf_out_len == 0x20)) && (vbf_out_len == 0x20)))) &&
           (iVar1 == 0)) {
          iVar1 = secp256k1_rangeproof_rewind
                            (ctx,vbf_out,value_out,message,&message_len,nonce_hash,&min_value,
                             &max_value,&commit,proof,proof_len,extra,extra_len,&gen);
          if (iVar1 != 0) {
            *(undefined8 *)(asset_out + 0x10) = message._16_8_;
            *(undefined8 *)(asset_out + 0x18) = message._24_8_;
            *(undefined8 *)asset_out = message._0_8_;
            *(undefined8 *)(asset_out + 8) = message._8_8_;
            *(undefined8 *)(abf_out + 0x10) = message._48_8_;
            *(undefined8 *)(abf_out + 0x18) = message._56_8_;
            *(undefined8 *)abf_out = message._32_8_;
            *(undefined8 *)(abf_out + 8) = message._40_8_;
            iVar3 = 0;
          }
        }
      }
    }
    wally_clear_3(&gen,0x40,&commit,0x40,message,0x40);
  }
  return iVar3;
}

Assistant:

int wally_asset_unblind_with_nonce(const unsigned char *nonce_hash, size_t nonce_hash_len,
                                   const unsigned char *proof, size_t proof_len,
                                   const unsigned char *commitment, size_t commitment_len,
                                   const unsigned char *extra, size_t extra_len,
                                   const unsigned char *generator, size_t generator_len,
                                   unsigned char *asset_out, size_t asset_out_len,
                                   unsigned char *abf_out, size_t abf_out_len,
                                   unsigned char *vbf_out, size_t vbf_out_len,
                                   uint64_t *value_out)
{
    const secp256k1_context *ctx = secp_ctx();
    secp256k1_generator gen;
    secp256k1_pedersen_commitment commit;
    unsigned char message[ASSET_TAG_LEN * 2];
    size_t message_len = sizeof(message);
    uint64_t min_value, max_value;
    int ret = WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    if (!nonce_hash || nonce_hash_len != SHA256_LEN ||
        !proof || !proof_len ||
        get_commitment(ctx, commitment, commitment_len, &commit) != WALLY_OK ||
        (extra_len && !extra) ||
        get_generator(ctx, generator, generator_len, &gen) != WALLY_OK ||
        !asset_out || asset_out_len != ASSET_TAG_LEN ||
        !abf_out || abf_out_len != BLINDING_FACTOR_LEN ||
        !vbf_out || vbf_out_len != BLINDING_FACTOR_LEN || !value_out)
        goto cleanup;

    /* Extract the value blinding factor, value and message from the rangeproof */
    if (!secp256k1_rangeproof_rewind(ctx, vbf_out, value_out,
                                     message, &message_len,
                                     nonce_hash, &min_value, &max_value,
                                     &commit, proof, proof_len,
                                     extra, extra_len,
                                     &gen))
        goto cleanup;

    /* FIXME: check results per blind.cpp */

    /* Extract the asset id and asset blinding factor from the message */
    memcpy(asset_out, message, ASSET_TAG_LEN);
    memcpy(abf_out, message + ASSET_TAG_LEN, ASSET_TAG_LEN);
    ret = WALLY_OK;

cleanup:
    wally_clear_3(&gen, sizeof(gen), &commit, sizeof(commit),
                  message, sizeof(message));
    return ret;
}